

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::ReduceRightHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  RecyclableObject *pRVar1;
  ThreadContext *this;
  code *pcVar2;
  double value;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  Var pvVar7;
  undefined4 extraout_var;
  undefined4 *puVar8;
  undefined4 extraout_var_00;
  JavascriptMethod p_Var9;
  uint64 uVar10;
  uint64 uVar11;
  char16_t *varName;
  uint32 index;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  Var local_50;
  TypedArrayBase *local_38;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00b9bddb:
    varName = L"[TypedArray].prototype.reduceRight";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.reduceRight";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar7 = Arguments::operator[](args,1);
  bVar3 = JavascriptConversion::IsCallable(pvVar7);
  if (!bVar3) goto LAB_00b9bddb;
  local_38 = typedArrayBase;
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar3 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    if (bVar3) {
      local_38 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
      local_38 = (TypedArrayBase *)0x0;
    }
  }
  pvVar7 = Arguments::operator[](args,1);
  jsReentLock._24_8_ = VarTo<Js::RecyclableObject>(pvVar7);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    if (length == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,(PCWSTR)0x0);
    }
    if (local_38 == (TypedArrayBase *)0x0) {
      index = length - 1;
      uVar13 = 1;
      do {
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar5 = JavascriptOperators::HasItem(obj,index);
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        if (BVar5 != 0) {
          *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          local_50 = JavascriptOperators::GetItem(obj,index,scriptContext);
          JsReentLock::MutateArrayObject((JsReentLock *)local_78);
          *(bool *)((long)local_78 + 0x108) = true;
          goto LAB_00b9bb7b;
        }
        index = index - 1;
        bVar3 = uVar13 < length;
        uVar13 = uVar13 + 1;
      } while (bVar3);
LAB_00b9bb37:
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,(PCWSTR)0x0);
    }
    bVar3 = VarIsCorrectType<Js::TypedArrayBase>(local_38);
    if (!bVar3) {
      bVar3 = VarIsCorrectType<Js::TypedArrayBase>(local_38);
      if (bVar3) {
LAB_00b9be32:
        Throw::FatalInternalError(-0x7fffbffb);
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2832,"(VarIsCorrectType(typedArrayBase))",
                                  "VarIsCorrectType(typedArrayBase)");
      if (bVar3) {
        *puVar8 = 0;
        goto LAB_00b9be32;
      }
      goto LAB_00b9bee6;
    }
    if ((local_38->super_ArrayBufferParent).super_ArrayObject.length == 0) goto LAB_00b9bb37;
    iVar6 = (*(local_38->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(local_38,(ulong)(length - 1));
    local_50 = (Var)CONCAT44(extraout_var,iVar6);
    uVar13 = 1;
  }
  else {
    local_50 = Arguments::operator[](args,2);
    uVar13 = 0;
LAB_00b9bb7b:
    if (local_38 == (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      local_50 = ReduceRightObjectHelper<unsigned_int>
                           (obj,length,uVar13,(RecyclableObject *)jsReentLock._24_8_,local_50,
                            scriptContext);
      goto LAB_00b9bdb6;
    }
  }
  pRVar1 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  bVar3 = VarIsCorrectType<Js::TypedArrayBase>(local_38);
  if (!bVar3) {
    bVar3 = VarIsCorrectType<Js::TypedArrayBase>(local_38);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2856,"(VarIsCorrectType(typedArrayBase))",
                                  "VarIsCorrectType(typedArrayBase)");
      if (!bVar3) {
LAB_00b9bee6:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    Throw::FatalInternalError(-0x7fffbffb);
  }
  uVar12 = (local_38->super_ArrayBufferParent).super_ArrayObject.length;
  if (length <= uVar12) {
    uVar12 = length;
  }
  if (uVar13 < uVar12) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    lVar15 = (ulong)uVar12 - (ulong)uVar13;
    uVar13 = ~uVar13 + length;
    do {
      iVar6 = (*(local_38->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(local_38,(ulong)uVar13);
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      this = scriptContext->threadContext;
      bVar3 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      if (scriptContext->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
      CheckIsExecutable((RecyclableObject *)jsReentLock._24_8_,p_Var9);
      p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
      if ((int)uVar13 < 0) {
        value = (double)uVar13;
        uVar10 = NumberUtilities::ToSpecial(value);
        bVar4 = NumberUtilities::IsNan(value);
        if (((bVar4) && (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0xfff8000000000000))
           && (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar4) goto LAB_00b9bee6;
          *puVar8 = 0;
        }
        uVar14 = uVar10 ^ 0xfffc000000000000;
      }
      else {
        uVar14 = (ulong)uVar13 | 0x1000000000000;
      }
      local_50 = (*p_Var9)((RecyclableObject *)jsReentLock._24_8_,(CallInfo)jsReentLock._24_8_,
                           0x2000005,0,0,0,0,0x2000005,pRVar1,local_50,
                           CONCAT44(extraout_var_00,iVar6),uVar14,local_38);
      this->reentrancySafeOrHandled = bVar3;
      JsReentLock::MutateArrayObject((JsReentLock *)local_78);
      *(bool *)((long)local_78 + 0x108) = true;
      uVar13 = uVar13 - 1;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
LAB_00b9bdb6:
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_50;
}

Assistant:

Var JavascriptArray::ReduceRightHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.reduceRight"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.reduceRight"));
            }
        }

        // If we came from Array.prototype.reduceRight and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var accumulator = nullptr;
        Var element = nullptr;
        T k = 0;
        T index = 0;

        if (args.Info.Count > 2)
        {
            accumulator = args[2];
        }
        else
        {
            if (length == 0)
            {
                JavascriptError::ThrowTypeError(scriptContext, VBSERR_ActionNotSupported);
            }

            bool bPresent = false;
            if (typedArrayBase)
            {
                AssertAndFailFast(VarIsCorrectType(typedArrayBase));
                uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

                for (; k < end && bPresent == false; k++)
                {
                    // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                    index = length - k - 1;
                    element = typedArrayBase->DirectGetItem((uint32)index);
                    bPresent = true;
                    accumulator = element;
                }
            }
            else
            {
                for (; k < length && bPresent == false; k++)
                {
                    index = length - k - 1;
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, index));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, accumulator = JavascriptOperators::GetItem(obj, index, scriptContext));
                        bPresent = true;
                    }
                }
            }
            if (bPresent == false)
            {
                JavascriptError::ThrowTypeError(scriptContext, VBSERR_ActionNotSupported);
            }
        }

        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                index = length - k - 1;
                element = typedArrayBase->DirectGetItem((uint32)index);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        accumulator = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 5), undefinedValue,
                                accumulator,
                                element,
                                JavascriptNumber::ToVar(index, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceRightObjectHelper<T>(obj, length, k, callBackFn, accumulator, scriptContext));
        }

        return accumulator;
    }